

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

pair<const_int,_int> * __thiscall
frozen::bits::LowerBound<int,frozen::impl::CompareKey<std::less<int>>>::
doitfirst<std::pair<int_const,int>const*,128ul>
          (LowerBound<int,frozen::impl::CompareKey<std::less<int>>> *this,long first)

{
  pair<const_int,_int> *ppVar1;
  
  if (*(int *)(first + 0x1f8) < **(int **)this) {
    ppVar1 = doitfirst<std::pair<int_const,int>const*,64ul>(this,first + 0x200);
    return ppVar1;
  }
  ppVar1 = doit_fast<std::pair<int_const,int>const*,31ul>
                     (this,first + (ulong)(*(int *)(first + 0xf8) < **(int **)this) * 0x100);
  return ppVar1;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }